

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O2

void __thiscall Automaton::visitReadNode(Automaton *this,ReadNode node)

{
  QStack<std::_Rb_tree_const_iterator<Node<Read>_>_> *this_00;
  ReadNode node_00;
  _Base_ptr p_Var1;
  int iVar2;
  _Rb_tree<std::_List_iterator<QString>,std::_List_iterator<QString>,std::_Identity<std::_List_iterator<QString>>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>
  *this_01;
  set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  *psVar3;
  iterator iVar4;
  int iVar5;
  _Base_ptr p_Var6;
  long in_FS_OFFSET;
  _Rb_tree_const_iterator<Node<Read>_> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_node = node._M_node;
  if (*(int *)&node._M_node[1].field_0x4 == 0) {
    iVar5 = this->_M_reads_dfn + 1;
    this->_M_reads_dfn = iVar5;
    *(int *)&node._M_node[1].field_0x4 = iVar5;
    this_00 = &this->_M_reads_stack;
    QList<std::_Rb_tree_const_iterator<Node<Read>>>::
    emplaceBack<std::_Rb_tree_const_iterator<Node<Read>>const&>
              ((QList<std::_Rb_tree_const_iterator<Node<Read>>> *)this_00,&local_40);
    p_Var6 = (_Base_ptr)&local_40._M_node[1]._M_right;
    while (p_Var6 = *(_Base_ptr *)p_Var6, p_Var6 != (_Base_ptr)&local_40._M_node[1]._M_right) {
      node_00._M_node = p_Var6->_M_left;
      visitReadNode(this,node_00);
      iVar2 = *(int *)&node_00._M_node[1].field_0x4;
      if (iVar5 < *(int *)&node_00._M_node[1].field_0x4) {
        iVar2 = iVar5;
      }
      *(int *)&local_40._M_node[1].field_0x4 = iVar2;
      this_01 = (_Rb_tree<std::_List_iterator<QString>,std::_List_iterator<QString>,std::_Identity<std::_List_iterator<QString>>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>
                 *)QMap<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                   ::operator[]((QMap<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                                 *)&local_40._M_node[1]._M_parent[2]._M_parent,
                                (_List_iterator<QString> *)&local_40._M_node[1]._M_left);
      psVar3 = QMap<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
               ::operator[]((QMap<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                             *)&node_00._M_node[1]._M_parent[2]._M_parent,
                            (_List_iterator<QString> *)&node_00._M_node[1]._M_left);
      std::
      _Rb_tree<std::_List_iterator<QString>,std::_List_iterator<QString>,std::_Identity<std::_List_iterator<QString>>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::_List_iterator<QString>>>
                (this_01,(psVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<std::_List_iterator<QString>_>)
                 &(psVar3->_M_t)._M_impl.super__Rb_tree_header);
    }
    if (*(int *)&local_40._M_node[1].field_0x4 == iVar5) {
      QList<std::_Rb_tree_const_iterator<Node<Read>_>_>::end
                (&this_00->super_QList<std::_Rb_tree_const_iterator<Node<Read>_>_>);
      do {
        iVar4 = QList<std::_Rb_tree_const_iterator<Node<Read>_>_>::end
                          (&this_00->super_QList<std::_Rb_tree_const_iterator<Node<Read>_>_>);
        p_Var1 = iVar4.i[-1]._M_node;
        QList<std::_Rb_tree_const_iterator<Node<Read>_>_>::takeLast
                  (&this_00->super_QList<std::_Rb_tree_const_iterator<Node<Read>_>_>);
        *(undefined4 *)&p_Var1[1].field_0x4 = 0x7fffffff;
      } while (local_40._M_node != p_Var1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Automaton::visitReadNode (ReadNode node)
{
  if (node->dfn != 0)
    return; // nothing to do

  int N = node->dfn = ++_M_reads_dfn;
  _M_reads_stack.push (node);

#ifndef QLALR_NO_DEBUG_INCLUDES
  // qerr() << "*** Debug. visit node (" << id (node->data.state) << ", " << node->data.nt << ")  N = " << N << Qt::endl;
#endif

  for (ReadsGraph::edge_iterator edge = node->begin (); edge != node->end (); ++edge)
    {
      ReadsGraph::iterator r = *edge;

      visitReadNode (r);

      node->dfn = qMin (N, r->dfn);

      NameSet &dst = node->data.state->reads [node->data.nt];
      NameSet &src = r->data.state->reads [r->data.nt];
      dst.insert (src.begin (), src.end ());
    }

  if (node->dfn == N)
    {
      ReadsGraph::iterator tos = _M_reads_stack.top ();

      do {
        tos = _M_reads_stack.top ();
        _M_reads_stack.pop ();
        tos->dfn = INT_MAX;
      } while (tos != node);
    }
}